

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

void nni_http_transact_conn(nni_http_conn *conn,nni_aio *aio)

{
  _Bool _Var1;
  http_txn *txn_00;
  nni_http_res *pnVar2;
  http_txn *txn;
  nni_aio *aio_local;
  nni_http_conn *conn_local;
  
  nni_aio_reset(aio);
  txn_00 = (http_txn *)nni_zalloc(0x210);
  if (txn_00 == (http_txn *)0x0) {
    nni_aio_finish_error(aio,NNG_ENOMEM);
  }
  else {
    nni_aio_init((nni_aio *)txn_00,http_txn_cb,txn_00);
    nni_aio_list_init(&txn_00->aios);
    txn_00->client = (nni_http_client *)0x0;
    txn_00->conn = conn;
    pnVar2 = nni_http_conn_res(conn);
    txn_00->res = pnVar2;
    txn_00->state = HTTP_SENDING;
    nni_http_res_reset(txn_00->res);
    nni_http_set_status(txn_00->conn,0,(char *)0x0);
    nni_mtx_lock(&http_txn_lk);
    _Var1 = nni_aio_start(aio,http_txn_cancel,txn_00);
    if (_Var1) {
      nni_list_append(&txn_00->aios,aio);
      nni_http_write_req(conn,(nni_aio *)txn_00);
      nni_mtx_unlock(&http_txn_lk);
    }
    else {
      nni_mtx_unlock(&http_txn_lk);
      http_txn_fini(txn_00);
    }
  }
  return;
}

Assistant:

void
nni_http_transact_conn(nni_http_conn *conn, nni_aio *aio)
{
	http_txn *txn;

	nni_aio_reset(aio);
	if ((txn = NNI_ALLOC_STRUCT(txn)) == NULL) {
		nni_aio_finish_error(aio, NNG_ENOMEM);
		return;
	}
	nni_aio_init(&txn->aio, http_txn_cb, txn);
	nni_aio_list_init(&txn->aios);
	txn->client = NULL;
	txn->conn   = conn;
	txn->res    = nni_http_conn_res(conn);
	txn->state  = HTTP_SENDING;

	nni_http_res_reset(txn->res);
	nni_http_set_status(txn->conn, 0, NULL);

	nni_mtx_lock(&http_txn_lk);
	if (!nni_aio_start(aio, http_txn_cancel, txn)) {
		nni_mtx_unlock(&http_txn_lk);
		http_txn_fini(txn);
		return;
	}
	nni_list_append(&txn->aios, aio);
	nni_http_write_req(conn, &txn->aio);
	nni_mtx_unlock(&http_txn_lk);
}